

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall pfederc::LogMessage::LogMessage(LogMessage *this,LogMessage *msg)

{
  this->_vptr_LogMessage = (_func_int **)&PTR__LogMessage_0010fc38;
  this->logLevel = msg->logLevel;
  std::__cxx11::string::string((string *)&this->msg,(string *)&msg->msg);
  std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector
            (&this->msgs,&msg->msgs);
  return;
}

Assistant:

LogMessage::LogMessage(const LogMessage &msg) noexcept
    : logLevel{msg.logLevel}, msg(msg.msg), msgs(msg.msgs) {
}